

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

ConstraintBlockSymbol *
slang::ast::ConstraintBlockSymbol::fromSyntax(Scope *scope,ConstraintDeclarationSyntax *syntax)

{
  SourceRange range;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  SymbolIndex SVar2;
  NameSyntax *pNVar3;
  SyntaxNode *this;
  Symbol *pSVar4;
  reference pTVar5;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  SourceRange in_stack_00000000;
  DiagCode in_stack_00000014;
  SymbolIndex in_stack_0000008c;
  SyntaxNode *in_stack_00000090;
  Token qual;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  ConstraintBlockSymbol *result;
  Token nameToken;
  Symbol *last;
  uint32_t index;
  Compilation *comp;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_fffffffffffffeb8;
  Diagnostic *in_stack_fffffffffffffec0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffec8;
  Type *type;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar6;
  Scope *in_stack_fffffffffffffed8;
  Diagnostic *in_stack_fffffffffffffee0;
  Compilation *args;
  SyntaxNode *in_stack_fffffffffffffef0;
  Compilation *this_00;
  ConstraintBlockSymbol *pCVar7;
  __extent_storage<18446744073709551615UL> _Var8;
  SyntaxNode *in_stack_ffffffffffffff10;
  bitmask<slang::ast::ConstraintBlockFlags> local_d9;
  SourceRange local_d8;
  SourceRange local_c8;
  undefined4 local_b6;
  bitmask<slang::ast::ConstraintBlockFlags> local_b1;
  undefined8 local_b0;
  Info *local_a8;
  Token *local_a0;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_98;
  SyntaxNode **local_90;
  SourceLocation local_78;
  string_view local_70;
  ConstraintBlockSymbol *local_60;
  Token local_58;
  SourceRange local_48;
  undefined4 local_34;
  Symbol *local_30;
  int local_24;
  Compilation *local_20;
  SyntaxNode *local_18;
  Scope *local_10;
  Scope *in_stack_fffffffffffffff8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = Scope::getCompilation(in_RDI);
  pNVar3 = not_null<slang::syntax::NameSyntax_*>::operator->
                     ((not_null<slang::syntax::NameSyntax_*> *)0xf859c0);
  if ((pNVar3->super_ExpressionSyntax).super_SyntaxNode.kind == ScopedName) {
    local_24 = 1;
    local_30 = Scope::getLastMember(local_10);
    if (local_30 != (Symbol *)0x0) {
      SVar2 = Symbol::getIndex(local_30);
      local_24 = SVar2 + 1;
    }
    this = (SyntaxNode *)
           not_null<slang::syntax::NameSyntax_*>::operator->
                     ((not_null<slang::syntax::NameSyntax_*> *)0xf85a3c);
    slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(this);
    Compilation::addOutOfBlockDecl
              ((Compilation *)__end2._M_current,(Scope *)qual.info,(ScopedNameSyntax *)qual._0_8_,
               in_stack_00000090,in_stack_0000008c);
    local_60 = (ConstraintBlockSymbol *)0x0;
  }
  else {
    pSVar4 = Scope::asSymbol(local_10);
    if (pSVar4->kind != ClassType) {
      local_34 = 0x200006;
      local_48 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff10);
      Scope::addDiag(in_stack_fffffffffffffff8,in_stack_00000014,in_stack_00000000);
    }
    not_null<slang::syntax::NameSyntax_*>::operator->
              ((not_null<slang::syntax::NameSyntax_*> *)0xf85af5);
    local_58 = slang::syntax::SyntaxNode::getLastToken(in_stack_fffffffffffffef0);
    args = local_20;
    this_00 = local_20;
    local_70 = parsing::Token::valueText
                         ((Token *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    local_78 = parsing::Token::location(&local_58);
    local_60 = BumpAllocator::
               emplace<slang::ast::ConstraintBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (&this_00->super_BumpAllocator,args,
                          (basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffffee0,(SourceLocation *)in_stack_fffffffffffffed8);
    Symbol::setSyntax(&local_60->super_Symbol,local_18);
    pCVar7 = local_60;
    _Var8._M_extent_value = (size_t)local_10;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    syntax_00._M_extent._M_extent_value = _Var8._M_extent_value;
    syntax_00._M_ptr = (pointer)pCVar7;
    Symbol::setAttributes((Symbol *)this_00,(Scope *)args,syntax_00);
    local_90 = &local_18[3].parent;
    local_98._M_current =
         (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                            (in_stack_fffffffffffffeb8);
    local_a0 = (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::end
                                  ((span<slang::parsing::Token,_18446744073709551615UL> *)
                                   in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::
                   operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffec0,
                              (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffeb8), ((bVar1 ^ 0xffU) & 1) != 0) {
      pTVar5 = __gnu_cxx::
               __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
               ::operator*(&local_98);
      local_b0._0_2_ = pTVar5->kind;
      local_b0._2_1_ = pTVar5->field_0x2;
      local_b0._3_1_ = pTVar5->numFlags;
      local_b0._4_4_ = pTVar5->rawLen;
      local_a8 = pTVar5->info;
      if ((undefined2)local_b0 == 0x11c) {
        bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_b1,Static);
        bitmask<slang::ast::ConstraintBlockFlags>::operator|=(&local_60->flags,&local_b1);
      }
      else if (((undefined2)local_b0 == 0xf8) || ((undefined2)local_b0 == 0xa7)) {
        local_b6 = 0xa40007;
        in_stack_fffffffffffffed8 = local_10;
        not_null<slang::syntax::ConstraintBlockSyntax_*>::operator->
                  ((not_null<slang::syntax::ConstraintBlockSyntax_*> *)0xf85cfa);
        local_c8 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff10);
        in_stack_fffffffffffffee0 =
             Scope::addDiag(in_stack_fffffffffffffff8,in_stack_00000014,in_stack_00000000);
        local_d8 = parsing::Token::range((Token *)in_stack_fffffffffffffee0);
        range.endLoc._0_7_ = in_stack_fffffffffffffed0;
        range.startLoc = (SourceLocation)in_stack_fffffffffffffec8;
        range.endLoc._7_1_ = in_stack_fffffffffffffed7;
        Diagnostic::operator<<(in_stack_fffffffffffffec0,range);
        break;
      }
      __gnu_cxx::
      __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
      ::operator++(&local_98);
    }
    addSpecifierFlags((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)in_stack_fffffffffffffee0,
                      (bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_fffffffffffffed8);
    type = (Type *)&local_60->flags;
    bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_d9,Static);
    bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                      ((bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_fffffffffffffec0,
                       (bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_fffffffffffffeb8);
    uVar6 = false;
    if (!bVar1) {
      pSVar4 = Scope::asSymbol(local_10);
      uVar6 = pSVar4->kind == ClassType;
    }
    if ((bool)uVar6 != false) {
      Scope::asSymbol(local_10);
      Symbol::as<slang::ast::ClassType>((Symbol *)0xf85e1f);
      addThisVar((ConstraintBlockSymbol *)CONCAT17(uVar6,in_stack_fffffffffffffed0),type);
    }
  }
  return local_60;
}

Assistant:

ConstraintBlockSymbol* ConstraintBlockSymbol::fromSyntax(
    const Scope& scope, const ConstraintDeclarationSyntax& syntax) {

    auto& comp = scope.getCompilation();
    if (syntax.name->kind == SyntaxKind::ScopedName) {
        // Remember the location in the parent scope where we *would* have inserted this
        // constraint, for later use during lookup.
        uint32_t index = 1;
        if (auto last = scope.getLastMember())
            index = (uint32_t)last->getIndex() + 1;

        comp.addOutOfBlockDecl(scope, syntax.name->as<ScopedNameSyntax>(), syntax,
                               SymbolIndex(index));
        return nullptr;
    }

    if (scope.asSymbol().kind != SymbolKind::ClassType)
        scope.addDiag(diag::ConstraintNotInClass, syntax.sourceRange());

    auto nameToken = syntax.name->getLastToken();
    auto result = comp.emplace<ConstraintBlockSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    // Static is the only allowed qualifier.
    for (auto qual : syntax.qualifiers) {
        if (qual.kind == TokenKind::StaticKeyword)
            result->flags |= ConstraintBlockFlags::Static;
        else if (qual.kind == TokenKind::PureKeyword || qual.kind == TokenKind::ExternKeyword) {
            // This is an error, pure and extern declarations can't declare bodies.
            scope.addDiag(diag::UnexpectedConstraintBlock, syntax.block->sourceRange())
                << qual.range();
            break;
        }
    }

    addSpecifierFlags(syntax.specifiers, result->flags);

    if (!result->flags.has(ConstraintBlockFlags::Static) &&
        scope.asSymbol().kind == SymbolKind::ClassType) {
        result->addThisVar(scope.asSymbol().as<ClassType>());
    }

    return result;
}